

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_commit.cxx
# Opt level: O2

bool __thiscall
nuraft::raft_server::wait_for_state_machine_pause(raft_server *this,size_t timeout_ms)

{
  byte bVar1;
  
  LOCK();
  (this->ea_sm_commit_exec_in_progress_->status)._M_i = idle;
  UNLOCK();
  bVar1 = 1;
  if (((this->sm_commit_exec_in_progress_)._M_base._M_i & 1U) != 0) {
    EventAwaiter::wait_ms(this->ea_sm_commit_exec_in_progress_,timeout_ms);
    bVar1 = (this->sm_commit_exec_in_progress_)._M_base._M_i ^ 1;
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool raft_server::wait_for_state_machine_pause(size_t timeout_ms) {
    ea_sm_commit_exec_in_progress_->reset();
    if (!sm_commit_exec_in_progress_) {
        return true;
    }
    ea_sm_commit_exec_in_progress_->wait_ms(timeout_ms);
    if (!sm_commit_exec_in_progress_) {
        return true;
    }
    return false;
}